

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,string *hex_string)

{
  pointer puVar1;
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  ByteData256 local_88;
  undefined1 local_70 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  
  this->_vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
  ByteData256::ByteData256(&this->data_);
  if ((pointer)hex_string->_M_string_length == (pointer)0x40) {
    StringUtil::StringToByte
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
               (string *)hex_string);
    local_38.current._M_current =
         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            )local_70._0_8_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,&local_30,&local_38,
               (allocator_type *)&local_88);
    ByteData256::ByteData256(&local_88,&local_50);
    puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_);
    }
    return;
  }
  local_70._0_8_ = "cfdcore_elements_transaction.cpp";
  local_70._8_4_ = 0x2a7;
  local_70._16_8_ = "BlindFactor";
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)hex_string->_M_string_length;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
             "Value hex-string-length Invalid. length={}.",(unsigned_long *)&local_50);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._0_8_ = local_70 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Value hex string length Invalid.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

BlindFactor::BlindFactor(const std::string &hex_string) : data_() {
  if (hex_string.size() != (kByteData256Length * 2)) {
    warn(
        CFD_LOG_SOURCE, "Value hex-string-length Invalid. length={}.",
        hex_string.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Value hex string length Invalid.");
  }
  const std::vector<uint8_t> &data = StringUtil::StringToByte(hex_string);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  data_ = ByteData256(reverse_buffer);
}